

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

bool __thiscall draco::PlyReader::ParseElement(PlyReader *this,DecoderBuffer *buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pPVar3;
  pointer pPVar4;
  undefined8 uVar5;
  int iVar6;
  mapped_type *pmVar7;
  bool bVar8;
  PlyReader *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string element_name;
  string line;
  DecoderBuffer line_buffer;
  string count_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  key_type local_120;
  longlong local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  DecoderBuffer local_d8;
  PlyElement local_a0;
  
  local_d8.bit_mode_ = buffer->bit_mode_;
  local_d8._49_1_ = buffer->field_0x31;
  local_d8.bitstream_version_ = buffer->bitstream_version_;
  local_d8._52_4_ = *(undefined4 *)&buffer->field_0x34;
  local_d8.data_ = buffer->data_;
  local_d8.data_size_ = buffer->data_size_;
  local_d8.pos_ = buffer->pos_;
  local_d8.bit_decoder_.bit_buffer_ = (buffer->bit_decoder_).bit_buffer_;
  local_d8.bit_decoder_.bit_buffer_end_ = (buffer->bit_decoder_).bit_buffer_end_;
  local_d8.bit_decoder_.bit_offset_ = (buffer->bit_decoder_).bit_offset_;
  local_f8._8_8_ = (pointer)0x0;
  local_e8[0] = '\0';
  this_00 = (PlyReader *)local_f8;
  local_f8._0_8_ = (pointer)local_e8;
  parser::ParseLine(&local_d8,(string *)this_00);
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  SplitWords(&local_138,this_00,(string *)local_f8);
  if (0x40 < (ulong)((long)local_138.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_138.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    iVar6 = std::__cxx11::string::compare
                      ((char *)local_138.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar6 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_120);
      paVar1 = &local_a0.name_.field_2;
      pcVar2 = local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      local_a0.name_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,
                 pcVar2 + local_138.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      local_100 = strtoll(local_a0.name_._M_dataplus._M_p,(char **)0x0,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.name_._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.name_._M_dataplus._M_p,
                        local_a0.name_.field_2._M_allocated_capacity + 1);
      }
      pPVar3 = (this->elements_).
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar4 = (this->elements_).
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->element_index_,&local_120);
      *pmVar7 = (int)((ulong)((long)pPVar4 - (long)pPVar3) >> 4) * -0x49249249;
      paVar1 = &local_a0.name_.field_2;
      local_a0.name_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_120._M_dataplus._M_p,
                 local_120._M_dataplus._M_p + local_120._M_string_length);
      local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a0.num_entries_ = local_100;
      local_a0.properties_.
      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.properties_.
      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.properties_.
      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a0.property_index_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::
      emplace_back<draco::PlyElement>(&this->elements_,&local_a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_a0.property_index_._M_t);
      std::vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>::~vector
                (&local_a0.properties_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.name_._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.name_._M_dataplus._M_p,
                        local_a0.name_.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_d8._48_8_;
      buffer->bit_mode_ = local_d8.bit_mode_;
      buffer->field_0x31 = local_d8._49_1_;
      buffer->bitstream_version_ = local_d8.bitstream_version_;
      (buffer->bit_decoder_).bit_buffer_end_ = local_d8.bit_decoder_.bit_buffer_end_;
      (buffer->bit_decoder_).bit_offset_ = local_d8.bit_decoder_.bit_offset_;
      buffer->pos_ = local_d8.pos_;
      (buffer->bit_decoder_).bit_buffer_ = local_d8.bit_decoder_.bit_buffer_;
      buffer->data_ = local_d8.data_;
      buffer->data_size_ = local_d8.data_size_;
      bVar8 = true;
      local_d8._48_8_ = uVar5;
      goto LAB_0011912b;
    }
  }
  bVar8 = false;
LAB_0011912b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_f8._0_8_ != (pointer)local_e8) {
    operator_delete((void *)local_f8._0_8_,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
  }
  DecoderBuffer::BitDecoder::~BitDecoder(&local_d8.bit_decoder_);
  return bVar8;
}

Assistant:

bool PlyReader::ParseElement(DecoderBuffer *buffer) {
  DecoderBuffer line_buffer(*buffer);
  std::string line;
  parser::ParseLine(&line_buffer, &line);

  std::string element_name;
  int64_t count;
  const std::vector<std::string> words = SplitWords(line);
  if (words.size() >= 3 && words[0] == "element") {
    element_name = words[1];
    const std::string count_str = words[2];
    count = strtoll(count_str.c_str(), nullptr, 10);
  } else {
    return false;
  }
  element_index_[element_name] = static_cast<uint32_t>(elements_.size());
  elements_.emplace_back(PlyElement(element_name, count));
  *buffer = line_buffer;
  return true;
}